

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_server.cpp
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  uint __fd;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_88 [8];
  Conn conn;
  int ret;
  sockaddr_in server_addr;
  int flags;
  int sock_fd;
  
  __fd = socket(2,1,0);
  pFVar1 = _stderr;
  if ((int)__fd < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"%s(%d)-<%s>: create socket failed! err: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
            ,0x12,"main",pcVar4);
    fflush(_stderr);
    exit(1);
  }
  uVar2 = fcntl(__fd,3,0);
  fcntl(__fd,4,(ulong)(uVar2 | 0x800));
  memset(&conn.field_0x5c,0,0x10);
  conn._92_2_ = 2;
  conn._94_2_ = htons(0x2382);
  conn._cur_handler = bind(__fd,(sockaddr *)&conn.field_0x5c,0x10);
  pFVar1 = _stderr;
  if (conn._cur_handler != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"%s(%d)-<%s>: bind sock failed, err: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
            ,0x21,"main",pcVar4);
    fflush(_stderr);
    exit(1);
  }
  conn._cur_handler = listen(__fd,0x400);
  pFVar1 = _stderr;
  if (conn._cur_handler != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"%s(%d)-<%s>: listen sock failed! err: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
            ,0x27,"main",pcVar4);
    fflush(_stderr);
    exit(1);
  }
  Conn::Conn((Conn *)local_88);
  Conn::init((Conn *)local_88,(EVP_PKEY_CTX *)(ulong)__fd);
  Conn::run((Conn *)local_88);
  close(__fd);
  pFVar1 = _stderr;
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fprintf(pFVar1,"%s(%d)-<%s>: server exit, status: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
          ,0x30,"main",pcVar4);
  fflush(_stderr);
  Conn::~Conn((Conn *)local_88);
  return 0;
}

Assistant:

int main()
{
    int sock_fd = socket(AF_INET, SOCK_STREAM, 0);
    if (sock_fd < 0)
    {
        LOG_PRINT("create socket failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    int flags = fcntl(sock_fd, F_GETFL, 0);
    fcntl(sock_fd, F_SETFL, flags | O_NONBLOCK);

    struct sockaddr_in server_addr;
    memset(&server_addr, 0, sizeof(server_addr));
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = INADDR_ANY;
    server_addr.sin_port = htons(ServerPort);

    int ret = bind(sock_fd, (struct sockaddr *)&server_addr, sizeof(server_addr));
    if (ret != 0)
    {
        LOG_PRINT("bind sock failed, err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    ret = listen(sock_fd, MaxFdSize);
    if (ret != 0)
    {
        LOG_PRINT("listen sock failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }

    Conn conn;
    conn.init(sock_fd, MaxFdSize);
    conn.run();

    close(sock_fd);
    LOG_PRINT("server exit, status: %s", strerror(errno));

    return 0;
}